

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsectoreffect.cpp
# Opt level: O2

void __thiscall DSectorEffect::Destroy(DSectorEffect *this)

{
  DSectorEffect *pDVar1;
  
  if (this->m_Sector != (sector_t_conflict *)0x0) {
    pDVar1 = GC::ReadBarrier<DSectorEffect>((DSectorEffect **)&this->m_Sector->floordata);
    if (pDVar1 == this) {
      (this->m_Sector->floordata).field_0.p = (DSectorEffect *)0x0;
    }
    pDVar1 = GC::ReadBarrier<DSectorEffect>((DSectorEffect **)&this->m_Sector->ceilingdata);
    if (pDVar1 == this) {
      (this->m_Sector->ceilingdata).field_0.p = (DSectorEffect *)0x0;
    }
    pDVar1 = GC::ReadBarrier<DSectorEffect>((DSectorEffect **)&this->m_Sector->lightingdata);
    if (pDVar1 == this) {
      (this->m_Sector->lightingdata).field_0.p = (DSectorEffect *)0x0;
    }
  }
  DThinker::Destroy(&this->super_DThinker);
  return;
}

Assistant:

void DSectorEffect::Destroy()
{
	if (m_Sector)
	{
		if (m_Sector->floordata == this)
		{
			m_Sector->floordata = NULL;
		}
		if (m_Sector->ceilingdata == this)
		{
			m_Sector->ceilingdata = NULL;
		}
		if (m_Sector->lightingdata == this)
		{
			m_Sector->lightingdata = NULL;
		}
	}
	Super::Destroy();
}